

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_SimpleArray<int>::Reverse(ON_SimpleArray<int> *this)

{
  int iVar1;
  int local_1c;
  int local_18;
  int j;
  int i;
  int t;
  ON_SimpleArray<int> *this_local;
  
  local_18 = 0;
  local_1c = this->m_count;
  for (; local_1c = local_1c + -1, local_18 < local_1c; local_18 = local_18 + 1) {
    iVar1 = this->m_a[local_18];
    this->m_a[local_18] = this->m_a[local_1c];
    this->m_a[local_1c] = iVar1;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Reverse()
{
  // NOTE:
  // If anything in "T" depends on the value of this's address,
  // then don't call Reverse().
  T t;
  int i = 0;  
  int j = m_count-1;
  for ( /*empty*/; i < j; i++, j-- ) {
    t = m_a[i];
    m_a[i] = m_a[j];
    m_a[j] = t;
  }
}